

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_reservoir_sample.cpp
# Opt level: O2

void __thiscall duckdb::SampleGlobalSinkState::~SampleGlobalSinkState(SampleGlobalSinkState *this)

{
  ~SampleGlobalSinkState(this);
  operator_delete(this);
  return;
}

Assistant:

explicit SampleGlobalSinkState(Allocator &allocator, SampleOptions &options) {
		if (options.is_percentage) {
			auto percentage = options.sample_size.GetValue<double>();
			if (percentage == 0) {
				return;
			}
			sample = make_uniq<ReservoirSamplePercentage>(allocator, percentage,
			                                              static_cast<int64_t>(options.seed.GetIndex()));
		} else {
			auto size = NumericCast<idx_t>(options.sample_size.GetValue<int64_t>());
			if (size == 0) {
				return;
			}
			sample = make_uniq<ReservoirSample>(allocator, size, static_cast<int64_t>(options.seed.GetIndex()));
		}
	}